

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O2

void mutexTestThr2(void *arg)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    deMutex_lock(*arg);
    iVar1 = *(int *)((long)arg + 8);
    if (*(int *)((long)arg + 0x10) <= iVar1) break;
    deYield();
    if (iVar1 != *(int *)((long)arg + 8)) {
      deAssertFail("localCounter == data->counter",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0xd1);
    }
    *(int *)((long)arg + 8) = iVar1 + 1;
    deMutex_unlock(*arg);
    iVar2 = iVar2 + 1;
  }
  deMutex_unlock(*arg);
  deMutex_lock(*arg);
  *(int *)((long)arg + 0xc) = *(int *)((long)arg + 0xc) + iVar2;
  deMutex_unlock(*arg);
  return;
}

Assistant:

static void mutexTestThr2 (void* arg)
{
	MutexData2* data = (MutexData2*)arg;
	deInt32 numIncremented = 0;

	for (;;)
	{
		deInt32 localCounter;
		deMutex_lock(data->mutex);

		if (data->counter >= data->maxVal)
		{
			deMutex_unlock(data->mutex);
			break;
		}

		localCounter = data->counter;
		deYield();

		DE_TEST_ASSERT(localCounter == data->counter);
		localCounter += 1;
		data->counter = localCounter;

		deMutex_unlock(data->mutex);

		numIncremented++;
	}

	deMutex_lock(data->mutex);
	data->counter2 += numIncremented;
	deMutex_unlock(data->mutex);
}